

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockContainer.cpp
# Opt level: O0

bool __thiscall
Rml::BlockContainer::EncloseChildBox
          (BlockContainer *this,LayoutBox *child,Vector2f child_position,float child_height,
          float child_margin_bottom)

{
  bool bVar1;
  Box *this_00;
  Vector2<float> VVar2;
  Vector2f VVar3;
  bool result;
  float local_78;
  Vector2f local_70;
  Vector2f local_68;
  Vector2f content_size;
  Vector2f local_38;
  Vector2<float> local_30;
  float local_28;
  float local_24;
  float child_margin_bottom_local;
  float child_height_local;
  LayoutBox *child_local;
  BlockContainer *this_local;
  Vector2f child_position_local;
  
  this_00 = &this->box;
  local_28 = child_margin_bottom;
  local_24 = child_height;
  _child_margin_bottom_local = child;
  child_local = (LayoutBox *)this;
  this_local = (BlockContainer *)child_position;
  local_38 = Box::GetPosition(this_00,Content);
  VVar2.x = (this->position).x;
  VVar2.y = (this->position).y;
  local_30 = Vector2<float>::operator+(&local_38,VVar2);
  Vector2<float>::operator-=((Vector2<float> *)&this_local,local_30);
  this->box_cursor = this_local._4_4_ + local_24 + local_28;
  VVar3 = this->inner_content_size;
  content_size = LayoutBox::GetVisibleOverflowSize(_child_margin_bottom_local);
  VVar2 = Vector2<float>::operator+((Vector2<float> *)&this_local,content_size);
  VVar3 = Math::Max<Rml::Vector2<float>>(VVar3,VVar2);
  this->inner_content_size = VVar3;
  VVar3 = Box::GetSize(this_00);
  local_78 = VVar3.x;
  Vector2<float>::Vector2(&local_70,local_78,this->box_cursor);
  local_68 = Math::Max<Rml::Vector2<float>>(local_70,this->inner_content_size);
  bVar1 = ContainerBox::CatchOverflow(&this->super_ContainerBox,local_68,this_00,this->max_height);
  return bVar1;
}

Assistant:

bool BlockContainer::EncloseChildBox(LayoutBox* child, Vector2f child_position, float child_height, float child_margin_bottom)
{
	child_position -= (box.GetPosition() + position);

	box_cursor = child_position.y + child_height + child_margin_bottom;

	// Extend the inner content size. The vertical size can be larger than the box_cursor due to overflow.
	inner_content_size = Math::Max(inner_content_size, child_position + child->GetVisibleOverflowSize());

	const Vector2f content_size = Math::Max(Vector2f{box.GetSize().x, box_cursor}, inner_content_size);

	const bool result = CatchOverflow(content_size, box, max_height);

	return result;
}